

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

void __thiscall
capnp::SchemaParser::ModuleImpl::addError
          (ModuleImpl *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  Vector<unsigned_int> *vec;
  SchemaFile *pSVar1;
  undefined4 uVar2;
  char *pcVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  undefined8 in_R9;
  ulong uVar9;
  uint32_t local_70;
  uint32_t local_6c;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t sStack_50;
  undefined **local_48;
  Lazy<kj::Vector<unsigned_int>_> *local_40;
  
  local_60 = message.content.size_;
  local_68 = message.content.ptr;
  local_70 = endByte;
  local_6c = startByte;
  if ((this->lineBreaks).once.futex != 3) {
    local_40 = &this->lineBreaks;
    local_48 = &PTR_run_00700840;
    kj::_::Once::runOnce();
  }
  vec = (this->lineBreaks).value.ptr;
  sVar6 = anon_unknown_31::findLargestElementBefore<unsigned_int>(vec,&local_6c);
  uVar9 = (ulong)local_6c;
  uVar8 = local_6c - (vec->builder).ptr[sVar6 & 0xffffffff];
  sVar7 = anon_unknown_31::findLargestElementBefore<unsigned_int>(vec,&local_70);
  pSVar1 = (this->file).ptr;
  local_58 = local_68;
  pcVar3 = local_58;
  sStack_50 = local_60;
  sVar5 = sStack_50;
  local_58._0_4_ = SUB84(local_68,0);
  uVar2 = local_58._0_4_;
  sStack_50._0_4_ = (undefined4)local_60;
  uVar4 = (undefined4)sStack_50;
  local_58 = pcVar3;
  sStack_50 = sVar5;
  (*pSVar1->_vptr_SchemaFile[5])
            (pSVar1,sVar6 << 0x20 | uVar9,(ulong)uVar8,(ulong)local_70 | sVar7 << 0x20,
             (ulong)(local_70 - (vec->builder).ptr[sVar7 & 0xffffffff]),in_R9,uVar2,uVar4);
  this->parser->hadErrors = true;
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    auto& lines = lineBreaks.get(
        [](kj::SpaceFor<kj::Vector<uint>>& space) {
          KJ_FAIL_REQUIRE("Can't report errors until loadContent() is called.");
          return space.construct();
        });

    // TODO(someday):  This counts tabs as single characters.  Do we care?
    uint startLine = findLargestElementBefore(lines, startByte);
    uint startCol = startByte - lines[startLine];
    uint endLine = findLargestElementBefore(lines, endByte);
    uint endCol = endByte - lines[endLine];

    file->reportError(
        SchemaFile::SourcePos { startByte, startLine, startCol },
        SchemaFile::SourcePos { endByte, endLine, endCol },
        message);

    // We intentionally only set hadErrors true if reportError() didn't throw.
    parser.hadErrors = true;
  }